

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int JX9StreamData_Open(char *zName,int iMode,jx9_value *pResource,void **ppHandle)

{
  char cVar1;
  char *pcVar2;
  sxi32 sVar3;
  ushort **ppuVar4;
  jx9_stream_data *pjVar5;
  char *pcVar6;
  int iVar7;
  jx9_vm *pVm;
  
  pcVar6 = zName;
  if (*zName != '\0') {
    pcVar2 = zName + 2;
    do {
      pcVar6 = pcVar2;
      if (pcVar6[-1] == '\0') {
        pcVar6 = pcVar6 + -1;
        goto LAB_0012f42d;
      }
      if (*pcVar6 == '\0') goto LAB_0012f42d;
      if (pcVar6[1] == '\0') {
        pcVar6 = pcVar6 + 1;
        goto LAB_0012f42d;
      }
      pcVar2 = pcVar6 + 4;
    } while (pcVar6[2] != '\0');
    pcVar6 = pcVar6 + 2;
  }
LAB_0012f42d:
  if ((int)pcVar6 != (int)zName) {
    iVar7 = (int)zName - (int)pcVar6;
    do {
      cVar1 = *zName;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      break;
      zName = zName + 1;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
  }
  sVar3 = SyStrnicmp(zName,"stdin",5);
  if (sVar3 == 0) {
    iVar7 = 1;
  }
  else {
    sVar3 = SyStrnicmp(zName,"output",6);
    if (sVar3 == 0) {
      iVar7 = 4;
    }
    else {
      sVar3 = SyStrnicmp(zName,"stdout",6);
      if (sVar3 == 0) {
        iVar7 = 2;
      }
      else {
        sVar3 = SyStrnicmp(zName,"stderr",6);
        if (sVar3 != 0) {
          return -1;
        }
        iVar7 = 3;
      }
    }
  }
  if (pResource == (jx9_value *)0x0) {
    pVm = (jx9_vm *)0x0;
  }
  else {
    pVm = pResource->pVm;
  }
  pjVar5 = JX9StreamDataInit(pVm,iVar7);
  if (pjVar5 == (jx9_stream_data *)0x0) {
    iVar7 = -1;
  }
  else {
    *ppHandle = pjVar5;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int JX9StreamData_Open(const char *zName, int iMode, jx9_value *pResource, void ** ppHandle)
{
	jx9_stream_data *pData;
	SyString sStream;
	SyStringInitFromBuf(&sStream, zName, SyStrlen(zName));
	/* Trim leading and trailing white spaces */
	SyStringFullTrim(&sStream);
	/* Stream to open */
	if( SyStrnicmp(sStream.zString, "stdin", sizeof("stdin")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDIN;
	}else if( SyStrnicmp(sStream.zString, "output", sizeof("output")-1) == 0 ){
		iMode = JX9_IO_STREAM_OUTPUT;
	}else if( SyStrnicmp(sStream.zString, "stdout", sizeof("stdout")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDOUT;
	}else if( SyStrnicmp(sStream.zString, "stderr", sizeof("stderr")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDERR;
	}else{
		/* unknown stream name */
		return -1;
	}
	/* Create our handle */
	pData = JX9StreamDataInit(pResource?pResource->pVm:0, iMode);
	if( pData == 0 ){
		return -1;
	}
	/* Make the handle public */
	*ppHandle = (void *)pData;
	return JX9_OK;
}